

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O2

void __thiscall InstructionGenerator::genCompareUnequal(InstructionGenerator *this,uint argCount)

{
  uint a;
  uint uVar1;
  allocator local_a5;
  uint argCount_local;
  undefined1 local_a0 [48];
  string local_70;
  undefined1 local_50 [48];
  
  local_a0._0_4_ = 0x11;
  argCount_local = argCount;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<Instruction>
            (this->bytecode,(Instruction *)local_a0);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)this->bytecode,&argCount_local);
  for (uVar1 = 0; uVar1 < argCount_local; uVar1 = uVar1 + 1) {
    VirtualStack::pop((Variable *)local_50,&this->super_VirtualStack);
    std::__cxx11::string::~string((string *)(local_50 + 8));
  }
  std::__cxx11::string::string((string *)&local_70,"",&local_a5);
  Variable::Variable((Variable *)local_a0,&local_70,BOOL);
  VirtualStack::push(&this->super_VirtualStack,(Variable *)local_a0);
  std::__cxx11::string::~string((string *)(local_a0 + 8));
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void InstructionGenerator::genCompareUnequal(unsigned int argCount)
{
    bytecode->emplace_back(Instruction::COMPARE_UNEQUAL);
    bytecode->emplace_back(argCount);
    for(unsigned int a = 0; a < argCount; a++)
        pop();
    push(Variable("", DataType::BOOL));
}